

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundCompoundCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
btCompoundCompoundCollisionAlgorithm::btCompoundCompoundCollisionAlgorithm
          (btCompoundCompoundCollisionAlgorithm *this,btCollisionAlgorithmConstructionInfo *ci,
          btCollisionObjectWrapper *body0Wrap,btCollisionObjectWrapper *body1Wrap,bool isSwapped)

{
  btHashedSimplePairCache *this_00;
  
  btCompoundCollisionAlgorithm::btCompoundCollisionAlgorithm
            (&this->super_btCompoundCollisionAlgorithm,ci,body0Wrap,body1Wrap,isSwapped);
  (this->super_btCompoundCollisionAlgorithm).super_btActivatingCollisionAlgorithm.
  super_btCollisionAlgorithm._vptr_btCollisionAlgorithm =
       (_func_int **)&PTR__btCompoundCompoundCollisionAlgorithm_00223f90;
  (this->m_removePairs).m_ownsMemory = true;
  (this->m_removePairs).m_data = (btSimplePair *)0x0;
  (this->m_removePairs).m_size = 0;
  (this->m_removePairs).m_capacity = 0;
  this_00 = (btHashedSimplePairCache *)btAlignedAllocInternal(0x68,0x10);
  btHashedSimplePairCache::btHashedSimplePairCache(this_00);
  this->m_childCollisionAlgorithmCache = this_00;
  this->m_compoundShapeRevision0 = body0Wrap->m_shape[3].m_shapeType;
  this->m_compoundShapeRevision1 = body1Wrap->m_shape[3].m_shapeType;
  return;
}

Assistant:

btCompoundCompoundCollisionAlgorithm::btCompoundCompoundCollisionAlgorithm( const btCollisionAlgorithmConstructionInfo& ci,const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap,bool isSwapped)
:btCompoundCollisionAlgorithm(ci,body0Wrap,body1Wrap,isSwapped)
{

	void* ptr = btAlignedAlloc(sizeof(btHashedSimplePairCache),16);
	m_childCollisionAlgorithmCache= new(ptr) btHashedSimplePairCache();

	const btCollisionObjectWrapper* col0ObjWrap = body0Wrap;
	btAssert (col0ObjWrap->getCollisionShape()->isCompound());

	const btCollisionObjectWrapper* col1ObjWrap = body1Wrap;
	btAssert (col1ObjWrap->getCollisionShape()->isCompound());
	
	const btCompoundShape* compoundShape0 = static_cast<const btCompoundShape*>(col0ObjWrap->getCollisionShape());
	m_compoundShapeRevision0 = compoundShape0->getUpdateRevision();

	const btCompoundShape* compoundShape1 = static_cast<const btCompoundShape*>(col1ObjWrap->getCollisionShape());
	m_compoundShapeRevision1 = compoundShape1->getUpdateRevision();
	
	
}